

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

long fs_c_lang(void)

{
  return 0x313ee;
}

Assistant:

long fs_c_lang(){
  // C version compiler claims to support with given options
#ifdef __STDC_VERSION__
  return __STDC_VERSION__;
#else  // MSVC if /std: not set
  return 0L;
#endif
}